

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O0

string * __thiscall ObservationModelDiscrete::SoftPrint_abi_cxx11_(ObservationModelDiscrete *this)

{
  ostream *poVar1;
  void *this_00;
  long *in_RSI;
  string *in_RDI;
  double dVar2;
  int s_ip;
  int ja_i;
  int jo_i;
  double p;
  stringstream ss;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"jo\tja\ts\'\tP (tuples with P==0 are not printed)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1b0 = 0; local_1b0 < (int)in_RSI[2]; local_1b0 = local_1b0 + 1) {
    for (local_1b4 = 0; local_1b4 < *(int *)((long)in_RSI + 0xc); local_1b4 = local_1b4 + 1) {
      for (local_1b8 = 0; local_1b8 < (int)in_RSI[1]; local_1b8 = local_1b8 + 1) {
        dVar2 = (double)(**(code **)(*in_RSI + 0x20))(in_RSI,local_1b4,local_1b8,local_1b0);
        if (0.0 < dVar2) {
          poVar1 = (ostream *)std::ostream::operator<<(local_188,local_1b0);
          poVar1 = std::operator<<(poVar1,"\t");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b4);
          poVar1 = std::operator<<(poVar1,"\t");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b8);
          poVar1 = std::operator<<(poVar1,"\t");
          this_00 = (void *)std::ostream::operator<<(poVar1,dVar2);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string ObservationModelDiscrete::SoftPrint() const
{
    stringstream ss;
    double p;
    ss << "jo\tja\ts'\tP (tuples with P==0 are not printed)"<<endl;
    for(int jo_i = 0; jo_i < _m_nrJointObservations; jo_i++)
        for(int ja_i = 0; ja_i < _m_nrJointActions; ja_i++)
            for(int s_ip = 0; s_ip < _m_nrStates; s_ip++)
            {
                p=Get(ja_i, s_ip, jo_i);
                if(p>0)
                    ss << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" << p
                         << endl;
            }
    return(ss.str());
}